

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilerBuffer.cpp
# Opt level: O1

void __thiscall helics::ProfilerBuffer::~ProfilerBuffer(ProfilerBuffer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  if ((this->mBuffers).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->mBuffers).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    writeFile(this);
  }
  pcVar2 = (this->mFileName)._M_dataplus._M_p;
  paVar1 = &(this->mFileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->mBuffers);
  return;
}

Assistant:

ProfilerBuffer::~ProfilerBuffer()
{
    try {
        if (!mBuffers.empty()) {
            writeFile();
        }
    }
    catch (const std::ios_base::failure&) {
    }
}